

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_parameters.h
# Opt level: O0

void __thiscall
sparse_parameters::set_default<std::pair<float,float>,GD::set_initial_gd_wrapper<sparse_parameters>>
          (sparse_parameters *this,pair<float,_float> *info)

{
  pair<float,_float> *this_00;
  type in_RSI;
  long in_RDI;
  pair<float,_float> *new_R;
  
  this_00 = calloc_or_throw<std::pair<float,float>>();
  std::pair<float,_float>::operator=(this_00,in_RSI);
  *(pair<float,_float> **)(in_RDI + 0x48) = this_00;
  *(code **)(in_RDI + 0x58) = GD::set_initial_gd_wrapper<sparse_parameters>::func;
  (**(code **)(in_RDI + 0x58))(*(undefined8 *)(in_RDI + 0x50),*(undefined8 *)(in_RDI + 0x48));
  return;
}

Assistant:

void set_default(R& info)
  {
    R& new_R = calloc_or_throw<R>();
    new_R = info;
    default_data = &new_R;
    fun = (void (*)(const weight*, void*))T::func;
    fun(default_value, default_data);
  }